

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O0

bool tinyusdz::detail::SerializeAttribute<float>
               (string *attr_name,TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *attr,
               string *value_str,string *err)

{
  bool bVar1;
  ostream *poVar2;
  string local_7b0 [32];
  string local_790 [39];
  allocator local_769;
  string local_768 [32];
  fmt local_748 [32];
  ostringstream local_728 [8];
  ostringstream ss_e_2;
  string local_5b0 [39];
  allocator local_589;
  string local_588 [32];
  fmt local_568 [32];
  ostringstream local_548 [8];
  ostringstream ss_e_1;
  string local_3d0;
  float local_3ac;
  Animatable<float> *pAStack_3a8;
  float value;
  Animatable<float> *animatable_value;
  string local_398 [39];
  allocator local_371;
  string local_370;
  string local_350;
  ostringstream local_330 [8];
  ostringstream ss_e;
  stringstream local_1b8 [8];
  stringstream value_ss;
  ostream aoStack_1a8 [376];
  string *local_30;
  string *err_local;
  string *value_str_local;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *attr_local;
  string *attr_name_local;
  
  local_30 = err;
  err_local = value_str;
  value_str_local = (string *)attr;
  attr_local = (TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)attr_name;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  bVar1 = TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::is_connection
                    ((TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)value_str_local);
  if (bVar1) {
    ::std::__cxx11::ostringstream::ostringstream(local_330);
    poVar2 = ::std::operator<<((ostream *)local_330,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"SerializeAttribute");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x1a6);
    ::std::operator<<(poVar2," ");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_370,"TODO: connection attribute",&local_371);
    fmt::format(&local_350,&local_370);
    poVar2 = ::std::operator<<((ostream *)local_330,(string *)&local_350);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::~string((string *)&local_350);
    ::std::__cxx11::string::~string((string *)&local_370);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_371);
    if (local_30 != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)local_30,local_398);
      ::std::__cxx11::string::~string(local_398);
    }
    attr_name_local._7_1_ = 0;
    animatable_value._4_4_ = 1;
    ::std::__cxx11::ostringstream::~ostringstream(local_330);
  }
  else {
    bVar1 = TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::is_blocked
                      ((TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)value_str_local);
    if (bVar1) {
      ::std::__cxx11::string::operator=((string *)err_local,"");
      attr_name_local._7_1_ = 1;
      animatable_value._4_4_ = 1;
    }
    else {
      pAStack_3a8 = TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::get_value
                              ((TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)
                               value_str_local);
      bVar1 = Animatable<float>::has_default(pAStack_3a8);
      if (bVar1) {
        bVar1 = Animatable<float>::get_scalar(pAStack_3a8,&local_3ac);
        if (bVar1) {
          poVar2 = ::std::operator<<(aoStack_1a8,"\"");
          to_xml_string<float>(&local_3d0,&local_3ac);
          poVar2 = ::std::operator<<(poVar2,(string *)&local_3d0);
          ::std::operator<<(poVar2,"\"");
          ::std::__cxx11::string::~string((string *)&local_3d0);
          ::std::__cxx11::stringstream::str();
          ::std::__cxx11::string::operator=((string *)err_local,local_7b0);
          ::std::__cxx11::string::~string(local_7b0);
          attr_name_local._7_1_ = 1;
          animatable_value._4_4_ = 1;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_548);
          poVar2 = ::std::operator<<((ostream *)local_548,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"SerializeAttribute");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x1b3);
          ::std::operator<<(poVar2," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_588,"Failed to get the value at default time of `{}`",&local_589);
          fmt::format<std::__cxx11::string>
                    (local_568,(string *)local_588,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)attr_local
                    );
          poVar2 = ::std::operator<<((ostream *)local_548,(string *)local_568);
          ::std::operator<<(poVar2,"\n");
          ::std::__cxx11::string::~string((string *)local_568);
          ::std::__cxx11::string::~string(local_588);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_589);
          if (local_30 != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::__cxx11::string::operator+=((string *)local_30,local_5b0);
            ::std::__cxx11::string::~string(local_5b0);
          }
          attr_name_local._7_1_ = 0;
          animatable_value._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_548);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_728);
        poVar2 = ::std::operator<<((ostream *)local_728,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"SerializeAttribute");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x1b9);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_768,"Failed to get the value of `{}`",&local_769);
        fmt::format<std::__cxx11::string>
                  (local_748,(string *)local_768,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)attr_local);
        poVar2 = ::std::operator<<((ostream *)local_728,(string *)local_748);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_748);
        ::std::__cxx11::string::~string(local_768);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_769);
        if (local_30 != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::__cxx11::string::operator+=((string *)local_30,local_790);
          ::std::__cxx11::string::~string(local_790);
        }
        attr_name_local._7_1_ = 0;
        animatable_value._4_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_728);
      }
    }
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return (bool)(attr_name_local._7_1_ & 1);
}

Assistant:

bool SerializeAttribute(const std::string &attr_name,
                        const TypedAttributeWithFallback<Animatable<T>> &attr,
                        std::string &value_str, std::string *err) {
  std::stringstream value_ss;

  if (attr.is_connection()) {
    PUSH_ERROR_AND_RETURN(fmt::format("TODO: connection attribute"));
  } else if (attr.is_blocked()) {
    // do nothing
    value_str = "";
    return true;
  } else {
    const Animatable<T> &animatable_value = attr.get_value();
    if (animatable_value.has_default()) {
      T value;
      if (animatable_value.get_scalar(&value)) {
        value_ss << "\"" << to_xml_string(value) << "\"";
      } else {
        PUSH_ERROR_AND_RETURN(fmt::format(
            "Failed to get the value at default time of `{}`", attr_name));
      }
    } else { 
      // no time-varying(timesamples) attribute in MaterialX.
      
      PUSH_ERROR_AND_RETURN(
          fmt::format("Failed to get the value of `{}`", attr_name));
    }
  }

  value_str = value_ss.str();
  return true;
}